

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

UniDirectionalLSTMLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_unidirectionallstm
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  UniDirectionalLSTMLayerParams *pUVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x1a4) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x1a4;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pUVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::UniDirectionalLSTMLayerParams>(arena);
    (this->layer_).unidirectionallstm_ = pUVar2;
  }
  return (UniDirectionalLSTMLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UniDirectionalLSTMLayerParams* NeuralNetworkLayer::_internal_mutable_unidirectionallstm() {
  if (!_internal_has_unidirectionallstm()) {
    clear_layer();
    set_has_unidirectionallstm();
    layer_.unidirectionallstm_ = CreateMaybeMessage< ::CoreML::Specification::UniDirectionalLSTMLayerParams >(GetArenaForAllocation());
  }
  return layer_.unidirectionallstm_;
}